

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Array * json::Json::createArray(Array *__return_storage_ptr__,Node *A)

{
  Production *pPVar1;
  const_reference VS_00;
  Node *VS;
  Node *A_local;
  Array *array;
  
  Array::Array(__return_storage_ptr__);
  pPVar1 = parser::Node::getProduction(A);
  VS_00 = std::vector<parser::Node,_std::allocator<parser::Node>_>::at(&pPVar1->nodes,1);
  nextValue(__return_storage_ptr__,VS_00);
  return __return_storage_ptr__;
}

Assistant:

static Array createArray(parser::Node const& A) {
            Array array;
            parser::Node const& VS = A.getProduction().nodes.at(1);
            nextValue(array, VS);
            return array;
        }